

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  basic_string_view<wchar_t> sep;
  wchar_t *pwVar1;
  undefined8 *in_RSI;
  long in_RDI;
  int in_stack_00000024;
  unsigned_long in_stack_00000028;
  wchar_t *in_stack_00000030;
  add_thousands_sep<wchar_t> in_stack_00000040;
  basic_string_view<wchar_t> s;
  add_thousands_sep<wchar_t> local_38;
  basic_string_view<wchar_t> local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  basic_string_view<wchar_t>::basic_string_view(&local_20,(wchar_t *)(in_RDI + 0xc),1);
  sep.size_ = local_20.size_;
  sep.data_ = local_20.data_;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_38,sep);
  pwVar1 = internal::
           format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000040);
  *local_10 = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }